

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

mod2entry * mod2sparse_find(mod2sparse *m,int row,int col)

{
  byte *pbVar1;
  uint uVar2;
  int col_00;
  int col_01;
  bool bVar3;
  mod2entry *pmVar4;
  mod2entry *extraout_RAX;
  mod2entry *extraout_RAX_00;
  mod2entry *pmVar5;
  mod2entry *extraout_RAX_01;
  mod2entry *extraout_RAX_02;
  mod2entry *extraout_RAX_03;
  mod2entry *pmVar6;
  mod2entry *r;
  mod2entry *r_00;
  void *__s;
  undefined4 in_register_00000034;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  pmVar4 = (mod2entry *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    pmVar4 = m->rows[(uint)row].left;
    if (-1 < pmVar4->row) {
      pmVar5 = m->rows + (uint)row;
      if (col <= pmVar4->col) {
        if (pmVar4->col == col) {
          return pmVar4;
        }
        pmVar4 = m->cols[(uint)col].up;
        iVar8 = pmVar4->row;
        if (row <= iVar8 && -1 < iVar8) {
          if (iVar8 == row) {
            return pmVar4;
          }
          pmVar4 = m->cols + (uint)col;
          while ((pmVar5 = pmVar5->right, -1 < pmVar5->row && (pmVar5->col <= col))) {
            if (pmVar5->col == col) {
              return pmVar5;
            }
            pmVar4 = pmVar4->down;
            if ((uint)row < (uint)pmVar4->row) {
              return (mod2entry *)0x0;
            }
            if (pmVar4->row == row) {
              return pmVar4;
            }
          }
        }
      }
    }
    return (mod2entry *)0x0;
  }
  mod2sparse_find_cold_1();
  if (pmVar4 != (mod2entry *)0x0) {
    if ((-1 < pmVar4->row) && (-1 < pmVar4->col)) {
      pmVar5 = pmVar4->left;
      pmVar5->right = pmVar4->right;
      pmVar4->right->left = pmVar5;
      pmVar5 = pmVar4->up;
      pmVar5->down = pmVar4->down;
      pmVar4->down->up = pmVar5;
      pmVar4->left = ((mod2entry *)m)->down;
      ((mod2entry *)m)->down = pmVar4;
      return extraout_RAX;
    }
    mod2sparse_delete_cold_1();
  }
  mod2sparse_delete_cold_2();
  uVar2 = ((mod2entry *)m)->row;
  if ((uVar2 != pmVar4->row) || (((mod2entry *)m)->col != pmVar4->col)) {
    mod2sparse_equal_cold_1();
    if ((((mod2entry *)m)->row == pmVar4->col) && (((mod2entry *)m)->col == pmVar4->row)) {
      if (pmVar4 != (mod2entry *)m) {
        mod2sparse_clear((mod2sparse *)pmVar4);
        pmVar5 = extraout_RAX_00;
        if (0 < ((mod2entry *)m)->row) {
          lVar10 = 0;
          do {
            for (pmVar5 = ((mod2entry *)m)->left[lVar10].right; -1 < pmVar5->row;
                pmVar5 = pmVar5->right) {
              mod2sparse_insert((mod2sparse *)pmVar4,pmVar5->col,(int)lVar10);
            }
            lVar10 = lVar10 + 1;
            pmVar5 = (mod2entry *)(long)((mod2entry *)m)->row;
          } while (lVar10 < (long)pmVar5);
        }
        return pmVar5;
      }
    }
    else {
      mod2sparse_transpose_cold_1();
    }
    mod2sparse_transpose_cold_2();
    if ((((((mod2entry *)m)->row == r->row) && (((mod2entry *)m)->col == r->col)) &&
        (pmVar4->row == r->row)) && (pmVar4->col == r->col)) {
      if ((r != (mod2entry *)m) && (r != pmVar4)) {
        mod2sparse_clear((mod2sparse *)r);
        pmVar5 = extraout_RAX_01;
        if (0 < r->row) {
          lVar10 = 0;
          do {
            pmVar5 = ((mod2entry *)m)->left[lVar10].right;
            pmVar6 = pmVar4->left[lVar10].right;
            while ((iVar8 = (int)lVar10, -1 < pmVar5->row && (-1 < pmVar6->row))) {
              col_00 = pmVar5->col;
              col_01 = pmVar6->col;
              if (col_00 == col_01) {
                pmVar5 = pmVar5->right;
LAB_001221eb:
                pmVar6 = pmVar6->right;
              }
              else {
                if (col_01 <= col_00) {
                  mod2sparse_insert((mod2sparse *)r,iVar8,col_01);
                  goto LAB_001221eb;
                }
                mod2sparse_insert((mod2sparse *)r,iVar8,col_00);
                pmVar5 = pmVar5->right;
              }
            }
            for (; -1 < pmVar5->row; pmVar5 = pmVar5->right) {
              mod2sparse_insert((mod2sparse *)r,iVar8,pmVar5->col);
            }
            for (; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
              mod2sparse_insert((mod2sparse *)r,iVar8,pmVar6->col);
            }
            lVar10 = lVar10 + 1;
            pmVar5 = (mod2entry *)(long)r->row;
          } while (lVar10 < (long)pmVar5);
        }
        return pmVar5;
      }
    }
    else {
      mod2sparse_add_cold_1();
    }
    mod2sparse_add_cold_2();
    if (((((mod2entry *)m)->col == pmVar4->row) && (((mod2entry *)m)->row == r_00->row)) &&
       (pmVar4->col == r_00->col)) {
      if ((r_00 != (mod2entry *)m) && (r_00 != pmVar4)) {
        mod2sparse_clear((mod2sparse *)r_00);
        pmVar5 = extraout_RAX_02;
        if (0 < ((mod2entry *)m)->row) {
          lVar10 = 0;
          do {
            if ((-1 < (((mod2entry *)m)->left[lVar10].right)->row) && (0 < pmVar4->col)) {
              lVar9 = 0;
              do {
                pmVar5 = ((mod2entry *)m)->left[lVar10].right;
                if (-1 < pmVar5->row) {
                  pmVar6 = pmVar4->right[lVar9].down;
                  bVar3 = false;
                  do {
                    iVar8 = pmVar6->row;
                    if (iVar8 < 0) break;
                    if (pmVar5->col == iVar8) {
                      bVar3 = (bool)(bVar3 ^ 1);
                      pmVar5 = pmVar5->right;
LAB_001222fe:
                      pmVar6 = pmVar6->down;
                    }
                    else {
                      if (iVar8 <= pmVar5->col) goto LAB_001222fe;
                      pmVar5 = pmVar5->right;
                    }
                  } while (-1 < pmVar5->row);
                  if (bVar3) {
                    mod2sparse_insert((mod2sparse *)r_00,(int)lVar10,(int)lVar9);
                  }
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < pmVar4->col);
            }
            lVar10 = lVar10 + 1;
            pmVar5 = (mod2entry *)(long)((mod2entry *)m)->row;
          } while (lVar10 < (long)pmVar5);
        }
        return pmVar5;
      }
    }
    else {
      mod2sparse_multiply_cold_1();
    }
    mod2sparse_multiply_cold_2();
    uVar2 = ((mod2entry *)m)->col;
    pmVar5 = extraout_RAX_03;
    if (0 < (long)((mod2entry *)m)->row) {
      pmVar5 = (mod2entry *)memset(__s,0,(long)((mod2entry *)m)->row);
    }
    if (0 < (int)uVar2) {
      pmVar5 = (mod2entry *)0x0;
      do {
        if (*(char *)((long)&pmVar5->row + (long)&pmVar4->row) != '\0') {
          for (pmVar6 = ((mod2entry *)m)->right[(long)pmVar5].down; -1 < pmVar6->row;
              pmVar6 = pmVar6->down) {
            pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar6->row);
            *pbVar1 = *pbVar1 ^ 1;
          }
        }
        pmVar5 = (mod2entry *)((long)&pmVar5->row + 1);
      } while (pmVar5 != (mod2entry *)(ulong)uVar2);
    }
    return pmVar5;
  }
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      pmVar5 = pmVar4->left[uVar7].right;
      for (pmVar6 = ((mod2entry *)m)->left[uVar7].right; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
        if (pmVar5->row < 0) {
          if (-1 < pmVar6->row) {
            return (mod2entry *)0x0;
          }
          break;
        }
        if (pmVar6->col != pmVar5->col) {
          return (mod2entry *)0x0;
        }
        pmVar5 = pmVar5->right;
      }
      if (-1 < pmVar5->row) {
        return (mod2entry *)0x0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  return (mod2entry *)0x1;
}

Assistant:

mod2entry *mod2sparse_find
( mod2sparse *m,
  int row,
  int col
)
{ 
  mod2entry *re, *ce;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_find: row or column index out of bounds\n");
    exit(1);
  }

  /* Check last entries in row and column. */

  re = mod2sparse_last_in_row(m,row);
  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { return 0;
  }
  if (mod2sparse_col(re)==col) 
  { return re;
  }

  ce = mod2sparse_last_in_col(m,col);
  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row)
  { return 0;
  }
  if (mod2sparse_row(ce)==row)
  { return ce;
  }

  /* Search row and column in parallel, from the front. */

  re = mod2sparse_first_in_row(m,row);
  ce = mod2sparse_first_in_col(m,col);

  for (;;)
  { 
    if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
    { return 0;
    } 
    if (mod2sparse_col(re)==col) 
    { return re;
    }

    if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
    { return 0;
    } 
    if (mod2sparse_row(ce)==row)
    { return ce;
    }

    re = mod2sparse_next_in_row(re);
    ce = mod2sparse_next_in_col(ce);
  }
}